

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O0

Value * __thiscall
soul::Value::createStruct
          (Value *__return_storage_ptr__,Value *this,Structure *s,ArrayView<soul::Value> members)

{
  ArrayView<soul::Value> values;
  PackedData local_70;
  Type local_48;
  undefined1 local_29;
  Value *local_28;
  Structure *s_local;
  ArrayView<soul::Value> members_local;
  Value *v;
  
  members_local.s = members.s;
  local_29 = 0;
  local_28 = this;
  s_local = s;
  members_local.e = __return_storage_ptr__;
  Type::createStruct(&local_48,(Structure *)this);
  Value(__return_storage_ptr__,&local_48);
  Type::~Type(&local_48);
  getData(&local_70,__return_storage_ptr__);
  values.e = members_local.s;
  values.s = (Value *)s_local;
  PackedData::setFrom(&local_70,values);
  return __return_storage_ptr__;
}

Assistant:

Value Value::createStruct (Structure& s, ArrayView<Value> members)
{
    Value v (Type::createStruct (s));
    v.getData().setFrom (members);
    return v;
}